

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QListViewPrivate::removeCurrentAndDisabled
          (QListViewPrivate *this,QList<QModelIndex> *indexes,QModelIndex *current)

{
  int iVar1;
  int iVar2;
  quintptr qVar3;
  QAbstractItemModel *pQVar4;
  QAbstractItemModel *pQVar5;
  quintptr qVar6;
  int iVar7;
  bool bVar8;
  iterator aend;
  iterator iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  QModelIndex *pQVar14;
  QModelIndex *pQVar15;
  const_iterator cVar16;
  long in_FS_OFFSET;
  QListViewPrivate *local_58;
  int local_50;
  int local_4c;
  quintptr local_48;
  QAbstractItemModel *local_40;
  long local_38;
  const_iterator __it;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = current->r;
  iVar2 = current->c;
  qVar3 = current->i;
  pQVar4 = (current->m).ptr;
  pQVar14 = (indexes->d).ptr;
  lVar13 = (indexes->d).size;
  lVar11 = lVar13;
  cVar16.i = pQVar14;
  local_58 = this;
  local_50 = iVar1;
  local_4c = iVar2;
  local_48 = qVar3;
  local_40 = pQVar4;
  if (0 < lVar13 >> 2) {
    lVar12 = (lVar13 >> 2) + 1;
    lVar11 = lVar13 * 0x18;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar16);
      __it.i = cVar16.i;
      if (bVar8) goto LAB_0056cb35;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar16.i + 1);
      __it.i = cVar16.i + 1;
      if (bVar8) goto LAB_0056cb35;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar16.i + 2);
      __it.i = cVar16.i + 2;
      if (bVar8) goto LAB_0056cb35;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
              ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                            *)&local_58,cVar16.i + 3);
      __it.i = cVar16.i + 3;
      if (bVar8) goto LAB_0056cb35;
      cVar16.i = cVar16.i + 4;
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x60;
    } while (1 < lVar12);
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
  }
  if (lVar11 != 1) {
    __it.i = cVar16.i;
    if (lVar11 != 2) {
      __it.i = pQVar14 + lVar13;
      if ((lVar11 != 3) ||
         (bVar8 = __gnu_cxx::__ops::
                  _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
                  ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                                *)&local_58,cVar16), __it.i = cVar16.i, bVar8)) goto LAB_0056cb35;
      __it.i = cVar16.i + 1;
    }
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
            ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                          *)&local_58,__it);
    if (bVar8) goto LAB_0056cb35;
    cVar16.i = __it.i + 1;
  }
  bVar8 = __gnu_cxx::__ops::
          _Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::$_0>
          ::operator()((_Iter_pred<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
                        *)&local_58,cVar16);
  __it.i = pQVar14 + lVar13;
  if (bVar8) {
    __it.i = cVar16.i;
  }
LAB_0056cb35:
  lVar13 = (long)__it.i - (long)pQVar14;
  if ((lVar13 >> 3) * -0x5555555555555555 - (indexes->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    aend = QList<QModelIndex>::end(indexes);
    iVar9 = QList<QModelIndex>::begin(indexes);
    cVar16.i = iVar9.i + lVar13;
    pQVar14 = lVar13 + iVar9.i;
    while (pQVar15 = pQVar14, pQVar14 = pQVar15 + 1, pQVar14 != aend.i) {
      pQVar5 = (this->super_QAbstractItemViewPrivate).model;
      uVar10 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,pQVar14);
      if (((uVar10 & 0x20) != 0) &&
         ((((pQVar14->r != iVar1 || (pQVar15[1].c != iVar2)) || (pQVar15[1].i != qVar3)) ||
          (pQVar15[1].m.ptr != pQVar4)))) {
        ((cVar16.i)->m).ptr = pQVar15[1].m.ptr;
        iVar7 = pQVar14->c;
        qVar6 = pQVar15[1].i;
        (cVar16.i)->r = pQVar14->r;
        (cVar16.i)->c = iVar7;
        (cVar16.i)->i = qVar6;
        cVar16.i = cVar16.i + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QList<QModelIndex>::erase(indexes,cVar16,(const_iterator)aend.i);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex> *indexes,
                                                const QModelIndex &current) const
{
    auto isCurrentOrDisabled = [this, current](const QModelIndex &index) {
        return !isIndexEnabled(index) || index == current;
    };
    indexes->removeIf(isCurrentOrDisabled);
}